

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_mesh.cpp
# Opt level: O0

bool __thiscall
ON_SubD::Internal_GetGeometryControlNetMesh
          (ON_SubD *this,ON_SubDLevel *level,ON_SubDLevelComponentIdIterator *vit_by_id,
          ON_SubDLevelComponentIdIterator *fit_by_id,ON_Mesh *mesh)

{
  bool bVar1;
  undefined8 this_00;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint count;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ON_SimpleArray<ON_3dPoint> *this_01;
  ON_3dPoint *this_02;
  ON_SubDVertex *pOVar8;
  bool *pbVar9;
  double *subdivision_point;
  uint *ngon_fi_00;
  ON_2udex *pOVar10;
  ON_MeshFace *pOVar11;
  uint local_260;
  uint local_240;
  uint local_1f8;
  uint local_198;
  uint local_194;
  uint i;
  uint ngon_Vcount;
  uint Fcount;
  ON_2udex ngon_span_1;
  uint ngon_dex;
  uint *ngon_vi;
  uint *ngon_fi;
  ON_SimpleArray<unsigned_int> ngon_buffer;
  uint ngon_face_count;
  unsigned_short fvi_1;
  ON_SubDVertex *vertex_2;
  uint Fcount0;
  uint Dcount0;
  uint dup_count0;
  ON_2udex ngon_span;
  ON_3dPoint center_point;
  ON_SubDVertex *vertex_1;
  undefined1 local_108 [6];
  unsigned_short fvi;
  ON_MeshFace meshf;
  ON_SubDFace *face_1;
  uint max_ngon_face_count;
  uint vi;
  ON_SubDVertex *vertex;
  undefined1 local_d8 [7];
  bool rc;
  ON_SimpleArray<ON_2udex> ngon_spans;
  ON_SimpleArray<bool> mesh_VertexNeedsDuplicated;
  ON_3dPointArray *D;
  size_t D_initial_capacity;
  ON_SubDFace *local_88;
  ON_SubDFace *face;
  uint max_ngon_Vcount;
  uint mesh_face_count;
  uint mesh_ngon_count;
  uint subd_vertex_count;
  ON_SimpleArray<VertexToDuplicate> dups_array;
  VertexToDuplicate dup;
  ON_Mesh *mesh_local;
  ON_SubDLevelComponentIdIterator *fit_by_id_local;
  ON_SubDLevelComponentIdIterator *vit_by_id_local;
  ON_SubDLevel *level_local;
  ON_SubD *this_local;
  
  VertexToDuplicate::VertexToDuplicate((VertexToDuplicate *)&dups_array.m_count);
  ON_SimpleArray<VertexToDuplicate>::ON_SimpleArray
            ((ON_SimpleArray<VertexToDuplicate> *)&mesh_ngon_count);
  uVar7 = level->m_vertex_count;
  max_ngon_Vcount = 0;
  face._4_4_ = 0;
  face._0_4_ = 0;
  for (local_88 = level->m_face[0]; local_88 != (ON_SubDFace *)0x0; local_88 = local_88->m_next_face
      ) {
    if (1 < local_88->m_edge_count) {
      if (local_88->m_edge_count < 5) {
        face._4_4_ = face._4_4_ + 1;
      }
      else {
        max_ngon_Vcount = max_ngon_Vcount + 1;
        face._4_4_ = local_88->m_edge_count + face._4_4_;
        if ((uint)face < local_88->m_edge_count) {
          face._0_4_ = (uint)local_88->m_edge_count;
        }
      }
    }
  }
  if ((uVar7 < 3) || (face._4_4_ == 0)) {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  else {
    this_01 = &ON_Mesh::DoublePrecisionVertices(mesh)->super_ON_SimpleArray<ON_3dPoint>;
    ON_SimpleArray<ON_3dPoint>::Reserve(this_01,(ulong)(uVar7 + max_ngon_Vcount));
    ON_SimpleArray<ON_3dPoint>::SetCount(this_01,0);
    ON_SimpleArray<bool>::ON_SimpleArray
              ((ON_SimpleArray<bool> *)&ngon_spans.m_count,(ulong)(uVar7 + max_ngon_Vcount));
    ON_SimpleArray<ON_MeshFace>::Reserve(&mesh->m_F,(ulong)face._4_4_);
    ON_SimpleArray<ON_MeshFace>::SetCount(&mesh->m_F,0);
    ON_SimpleArray<ON_2udex>::ON_SimpleArray
              ((ON_SimpleArray<ON_2udex> *)local_d8,(ulong)max_ngon_Vcount);
    bVar1 = false;
    _max_ngon_face_count = ON_SubDLevelComponentIdIterator::FirstVertex(vit_by_id);
    while ((((_max_ngon_face_count != (ON_SubDVertex *)0x0 &&
             (uVar3 = ON_SubDComponentBase::ArchiveId
                                (&_max_ngon_face_count->super_ON_SubDComponentBase), uVar3 != 0)) &&
            (uVar3 <= uVar7)) &&
           (uVar4 = ON_SimpleArray<ON_3dPoint>::UnsignedCount(this_01), uVar4 + 1 == uVar3))) {
      this_02 = ON_SimpleArray<ON_3dPoint>::AppendNew(this_01);
      ON_3dPoint::operator=(this_02,_max_ngon_face_count->m_P);
      bVar2 = VertexToDuplicate::NeedsDuplicated(_max_ngon_face_count);
      pbVar9 = ON_SimpleArray<bool>::AppendNew((ON_SimpleArray<bool> *)&ngon_spans.m_count);
      *pbVar9 = bVar2;
      _max_ngon_face_count = ON_SubDLevelComponentIdIterator::NextVertex(vit_by_id);
    }
    uVar3 = ON_SimpleArray<ON_3dPoint>::UnsignedCount(this_01);
    if (uVar3 == uVar7) {
      ON_SimpleArray<ON_2udex>::Reserve((ON_SimpleArray<ON_2udex> *)local_d8,(ulong)max_ngon_Vcount)
      ;
      face_1._0_4_ = 0;
      meshf.vi._8_8_ = ON_SubDLevelComponentIdIterator::FirstFace(fit_by_id);
      while (meshf.vi._8_8_ != 0) {
        memset(local_108,0,0x10);
        this_00 = meshf.vi._8_8_;
        if (*(ushort *)(meshf.vi._8_8_ + 0x9c) < 5) {
          if (2 < *(ushort *)(meshf.vi._8_8_ + 0x9c)) {
            for (vertex_1._6_2_ = 0; vertex_1._6_2_ < *(ushort *)(meshf.vi._8_8_ + 0x9c);
                vertex_1._6_2_ = vertex_1._6_2_ + 1) {
              pOVar8 = ON_SubDFace::Vertex((ON_SubDFace *)meshf.vi._8_8_,(uint)vertex_1._6_2_);
              if (pOVar8 == (ON_SubDVertex *)0x0) {
                local_1f8 = 0;
              }
              else {
                local_1f8 = ON_SubDComponentBase::ArchiveId(&pOVar8->super_ON_SubDComponentBase);
              }
              *(uint *)(local_108 + (ulong)vertex_1._6_2_ * 4) = local_1f8;
              if ((*(int *)(local_108 + (ulong)vertex_1._6_2_ * 4) < 1) ||
                 ((int)uVar7 < *(int *)(local_108 + (ulong)vertex_1._6_2_ * 4))) {
                local_108._0_4_ = 0xffffffff;
                break;
              }
              *(int *)(local_108 + (ulong)vertex_1._6_2_ * 4) =
                   *(int *)(local_108 + (ulong)vertex_1._6_2_ * 4) + -1;
              pbVar9 = ON_SimpleArray<bool>::operator[]
                                 ((ON_SimpleArray<bool> *)&ngon_spans.m_count,
                                  *(int *)(local_108 + (ulong)vertex_1._6_2_ * 4));
              if ((*pbVar9 & 1U) != 0) {
                dups_array._16_8_ = pOVar8;
                ON_SimpleArray<ON_MeshFace>::UnsignedCount(&mesh->m_F);
                ON_SimpleArray<VertexToDuplicate>::Append
                          ((ON_SimpleArray<VertexToDuplicate> *)&mesh_ngon_count,
                           (VertexToDuplicate *)&dups_array.m_count);
              }
            }
            if (local_108._0_4_ != 0xffffffff) {
              if (*(short *)(meshf.vi._8_8_ + 0x9c) == 3) {
                meshf.vi[1] = meshf.vi[0];
              }
              ON_SimpleArray<ON_MeshFace>::Append(&mesh->m_F,(ON_MeshFace *)local_108);
            }
          }
        }
        else {
          subdivision_point = ON_3dPoint::operator_cast_to_double_((ON_3dPoint *)&ngon_span);
          bVar2 = ON_SubDFace::GetSubdivisionPoint((ON_SubDFace *)this_00,subdivision_point);
          if (bVar2) {
            uVar3 = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&mesh->m_F);
            ON_2udex::ON_2udex((ON_2udex *)&Dcount0,uVar3,0);
            uVar3 = ON_SimpleArray<VertexToDuplicate>::UnsignedCount
                              ((ON_SimpleArray<VertexToDuplicate> *)&mesh_ngon_count);
            uVar4 = ON_SimpleArray<ON_3dPoint>::UnsignedCount(this_01);
            count = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&mesh->m_F);
            meshf.vi[0] = uVar4;
            meshf.vi[1] = uVar4;
            pOVar8 = ON_SubDFace::Vertex((ON_SubDFace *)meshf.vi._8_8_,0);
            if (pOVar8 == (ON_SubDVertex *)0x0) {
              local_240 = 0;
            }
            else {
              local_240 = ON_SubDComponentBase::ArchiveId(&pOVar8->super_ON_SubDComponentBase);
            }
            stack0xfffffffffffffefc = local_240;
            if ((0 < (int)local_240) && ((int)local_240 <= (int)uVar7)) {
              register0x00000000 = local_240 - 1;
              pbVar9 = ON_SimpleArray<bool>::operator[]
                                 ((ON_SimpleArray<bool> *)&ngon_spans.m_count,register0x00000000);
              if ((*pbVar9 & 1U) != 0) {
                dups_array._16_8_ = pOVar8;
                ON_SimpleArray<ON_MeshFace>::UnsignedCount(&mesh->m_F);
                ON_SimpleArray<VertexToDuplicate>::Append
                          ((ON_SimpleArray<VertexToDuplicate> *)&mesh_ngon_count,
                           (VertexToDuplicate *)&dups_array.m_count);
              }
              ngon_buffer.m_capacity._3_1_ = 0;
              ON_SimpleArray<bool>::Append
                        ((ON_SimpleArray<bool> *)&ngon_spans.m_count,
                         (bool *)((long)&ngon_buffer.m_capacity + 3));
              ON_SimpleArray<ON_3dPoint>::Append(this_01,(ON_3dPoint *)&ngon_span);
              for (ngon_buffer.m_capacity._0_2_ = 1;
                  (ushort)ngon_buffer.m_capacity <= *(ushort *)(meshf.vi._8_8_ + 0x9c);
                  ngon_buffer.m_capacity._0_2_ = (ushort)ngon_buffer.m_capacity + 1) {
                local_108._0_4_ = stack0xfffffffffffffefc;
                pOVar8 = ON_SubDFace::Vertex((ON_SubDFace *)meshf.vi._8_8_,
                                             (uint)(ushort)ngon_buffer.m_capacity %
                                             (uint)*(ushort *)(meshf.vi._8_8_ + 0x9c));
                if (pOVar8 == (ON_SubDVertex *)0x0) {
                  local_260 = 0;
                }
                else {
                  local_260 = ON_SubDComponentBase::ArchiveId(&pOVar8->super_ON_SubDComponentBase);
                }
                stack0xfffffffffffffefc = local_260;
                if (((int)local_260 < 1) || ((int)uVar7 < (int)local_260)) {
                  local_108._0_4_ = 0xffffffff;
                  break;
                }
                register0x00000000 = local_260 - 1;
                if (((ushort)ngon_buffer.m_capacity < *(ushort *)(meshf.vi._8_8_ + 0x9c)) &&
                   (pbVar9 = ON_SimpleArray<bool>::operator[]
                                       ((ON_SimpleArray<bool> *)&ngon_spans.m_count,
                                        register0x00000000), (*pbVar9 & 1U) != 0)) {
                  dups_array._16_8_ = pOVar8;
                  ON_SimpleArray<ON_MeshFace>::UnsignedCount(&mesh->m_F);
                  ON_SimpleArray<VertexToDuplicate>::Append
                            ((ON_SimpleArray<VertexToDuplicate> *)&mesh_ngon_count,
                             (VertexToDuplicate *)&dups_array.m_count);
                }
                ON_SimpleArray<ON_MeshFace>::Append(&mesh->m_F,(ON_MeshFace *)local_108);
              }
              dup_count0 = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&mesh->m_F);
              uVar5 = dup_count0 - Dcount0;
              ngon_buffer.m_count = uVar5;
              if ((local_108._0_4_ == 0xffffffff) ||
                 (uVar6 = ON_SubDFace::EdgeCount((ON_SubDFace *)meshf.vi._8_8_), uVar5 != uVar6)) {
                ON_SimpleArray<ON_3dPoint>::SetCount(this_01,uVar4);
                ON_SimpleArray<ON_MeshFace>::SetCount(&mesh->m_F,count);
                ON_SimpleArray<VertexToDuplicate>::SetCount
                          ((ON_SimpleArray<VertexToDuplicate> *)&mesh_ngon_count,uVar3);
              }
              else {
                dup_count0 = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&mesh->m_F);
                if ((2 < (uint)ngon_buffer.m_count) &&
                   (ON_SimpleArray<ON_2udex>::Append
                              ((ON_SimpleArray<ON_2udex> *)local_d8,(ON_2udex *)&Dcount0),
                   (uint)face_1 < (uint)ngon_buffer.m_count)) {
                  face_1._0_4_ = ngon_buffer.m_count;
                }
              }
            }
          }
        }
        meshf.vi._8_8_ = ON_SubDLevelComponentIdIterator::NextFace(fit_by_id);
      }
      uVar7 = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&mesh->m_F);
      if (uVar7 != 0) {
        bVar1 = true;
      }
    }
    ON_SubDLevel::ClearArchiveId(level);
    if (bVar1) {
      uVar7 = ON_SimpleArray<ON_3dPoint>::UnsignedCount(this_01);
      if ((uVar7 < 3) ||
         (uVar7 = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&mesh->m_F), uVar7 == 0)) {
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
      }
      else {
        Internal_DuplicateVertices
                  (mesh,(ON_3dPointArray *)this_01,
                   (ON_SimpleArray<VertexToDuplicate> *)&mesh_ngon_count);
        uVar7 = ON_SimpleArray<ON_2udex>::UnsignedCount((ON_SimpleArray<ON_2udex> *)local_d8);
        if ((uVar7 != 0) && (2 < (uint)face)) {
          ON_SimpleArray<unsigned_int>::ON_SimpleArray((ON_SimpleArray<unsigned_int> *)&ngon_fi);
          ngon_fi_00 = ON_SimpleArray<unsigned_int>::Reserve
                                 ((ON_SimpleArray<unsigned_int> *)&ngon_fi,(ulong)((uint)face * 2));
          for (ngon_span_1.i = 0;
              uVar7 = ON_SimpleArray<ON_2udex>::UnsignedCount((ON_SimpleArray<ON_2udex> *)local_d8),
              ngon_span_1.i < uVar7; ngon_span_1.i = ngon_span_1.i + 1) {
            pOVar10 = ON_SimpleArray<ON_2udex>::operator[]
                                ((ON_SimpleArray<ON_2udex> *)local_d8,ngon_span_1.i);
            Fcount = (*pOVar10).j;
            ngon_Vcount = (*pOVar10).i;
            if (2 < Fcount - ngon_Vcount) {
              *ngon_fi_00 = ngon_Vcount;
              pOVar11 = ON_SimpleArray<ON_MeshFace>::operator[](&mesh->m_F,*ngon_fi_00);
              *ngon_fi_00 = pOVar11->vi[0];
              local_194 = 0;
              for (local_198 = ngon_Vcount; local_198 < Fcount; local_198 = local_198 + 1) {
                ngon_fi_00[local_194] = local_198;
                pOVar11 = ON_SimpleArray<ON_MeshFace>::operator[](&mesh->m_F,local_198);
                (ngon_fi_00 + (uint)face)[local_194] = pOVar11->vi[0];
                local_194 = local_194 + 1;
              }
              ON_Mesh::AddNgon(mesh,local_194,ngon_fi_00 + (uint)face,local_194,ngon_fi_00);
            }
          }
          ON_SimpleArray<unsigned_int>::~ON_SimpleArray((ON_SimpleArray<unsigned_int> *)&ngon_fi);
        }
        this_local._7_1_ = true;
      }
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local._7_1_ = false;
    }
    ON_SimpleArray<ON_2udex>::~ON_SimpleArray((ON_SimpleArray<ON_2udex> *)local_d8);
    ON_SimpleArray<bool>::~ON_SimpleArray((ON_SimpleArray<bool> *)&ngon_spans.m_count);
  }
  ON_SimpleArray<VertexToDuplicate>::~ON_SimpleArray
            ((ON_SimpleArray<VertexToDuplicate> *)&mesh_ngon_count);
  return this_local._7_1_;
}

Assistant:

bool ON_SubD::Internal_GetGeometryControlNetMesh(
  const ON_SubDLevel& level,
  ON_SubDLevelComponentIdIterator& vit_by_id,
  ON_SubDLevelComponentIdIterator& fit_by_id,
  ON_Mesh& mesh
) const
{
  VertexToDuplicate dup;
  ON_SimpleArray<VertexToDuplicate> dups_array;

  const unsigned int subd_vertex_count = level.m_vertex_count;

  unsigned int mesh_ngon_count = 0;
  unsigned int mesh_face_count = 0;
  unsigned int max_ngon_Vcount = 0;
  for (const ON_SubDFace* face = level.m_face[0]; nullptr != face; face = face->m_next_face)
  {
    if ( face->m_edge_count < 2 )
      continue;
    if (face->m_edge_count <= 4)
    {
      mesh_face_count++;
      continue;
    }
    mesh_ngon_count++;
    mesh_face_count += face->m_edge_count;
    if ( max_ngon_Vcount < face->m_edge_count )
      max_ngon_Vcount = face->m_edge_count;
  }

  if (subd_vertex_count < 3 || mesh_face_count < 1 )
    return ON_SUBD_RETURN_ERROR(false);

  const size_t D_initial_capacity = subd_vertex_count + mesh_ngon_count;
  ON_3dPointArray& D = mesh.DoublePrecisionVertices();
  D.Reserve(D_initial_capacity);
  D.SetCount(0);
  ON_SimpleArray<bool> mesh_VertexNeedsDuplicated(D_initial_capacity);

  mesh.m_F.Reserve(mesh_face_count);
  mesh.m_F.SetCount(0);

  ON_SimpleArray< ON_2udex > ngon_spans(mesh_ngon_count);

  bool rc = false;
  for (;;)
  {
    // must iterate vertices in order of increasing id
    for (const ON_SubDVertex* vertex = vit_by_id.FirstVertex(); nullptr != vertex; vertex = vit_by_id.NextVertex())
    {
      unsigned int vi = vertex->ArchiveId();
      if (vi < 1 || vi > subd_vertex_count)
        break;
      if (D.UnsignedCount()+1 != vi)
        break;
      D.AppendNew() = vertex->m_P;
      mesh_VertexNeedsDuplicated.AppendNew() = VertexToDuplicate::NeedsDuplicated(vertex);
    }

    if (D.UnsignedCount() != subd_vertex_count)
      break;

    ngon_spans.Reserve(mesh_ngon_count);
    unsigned int max_ngon_face_count = 0;
    mesh_face_count = 0;
    // must iterate faces in order of increasing id
    for (const ON_SubDFace* face = fit_by_id.FirstFace(); nullptr != face; face = fit_by_id.NextFace())
    {
      ON_MeshFace meshf = {};
      
      if (face->m_edge_count <= 4)
      {
        // SubD quad face or 3-gon face gets a single ON_Mesh face
        if (face->m_edge_count < 3)
          continue;

        //const bool bQuad = 4 == face->m_edge_count;

        for (unsigned short fvi = 0; fvi < face->m_edge_count; fvi++)
        {
          const ON_SubDVertex* vertex = face->Vertex(fvi);
          meshf.vi[fvi] = (int)((nullptr != vertex) ? vertex->ArchiveId() : 0U);
          if (meshf.vi[fvi] < 1 || meshf.vi[fvi] > (int)subd_vertex_count)
          {
            meshf.vi[0] = -1;
            break;
          }
          meshf.vi[fvi]--;
          if (mesh_VertexNeedsDuplicated[meshf.vi[fvi]])
          {
            dup.m_vertex = vertex;
            dup.m_face = face;
            dup.m_mesh_F_index = mesh.m_F.UnsignedCount();
            dup.m_mesh_V_index = meshf.vi[fvi];
            dups_array.Append(dup);
          }
        }
        if (-1 == meshf.vi[0] )
          continue;
        if ( 3 == face->m_edge_count)
          meshf.vi[3] = meshf.vi[2];
        mesh.m_F.Append(meshf);
        continue;
      }
      else // face->m_edge_count >= 5
      {
        // SubD n-gon face with n >= 5 gets n ON_Mesh triangles grouped into
        ON_3dPoint center_point;
        if (false == face->GetSubdivisionPoint( center_point))
          continue;

        ON_2udex ngon_span = { mesh.m_F.UnsignedCount(), 0 };

        const unsigned int dup_count0 = dups_array.UnsignedCount();

        const unsigned int Dcount0 = D.UnsignedCount();
        const unsigned int Fcount0 = mesh.m_F.UnsignedCount();
        meshf.vi[2] = (int)Dcount0;
        meshf.vi[3] = meshf.vi[2];

        const ON_SubDVertex* vertex = face->Vertex(0);
        meshf.vi[1] = (nullptr != vertex) ? vertex->ArchiveId() : 0;
        if (meshf.vi[1] < 1 || meshf.vi[1] > (int)subd_vertex_count)
          continue;
        meshf.vi[1]--;

        if (mesh_VertexNeedsDuplicated[meshf.vi[1]])
        {
          dup.m_vertex = vertex;
          dup.m_face = face;
          dup.m_mesh_F_index = mesh.m_F.UnsignedCount();
          dup.m_mesh_V_index = meshf.vi[1];
          dups_array.Append(dup);
        }

        mesh_VertexNeedsDuplicated.Append(false);
        D.Append(center_point);

        for (unsigned short fvi = 1; fvi <= face->m_edge_count; fvi++)
        {
          meshf.vi[0] = meshf.vi[1];
          vertex = face->Vertex(fvi % face->m_edge_count);
          meshf.vi[1] = (int)((nullptr != vertex) ? vertex->ArchiveId() : 0U);
          if (meshf.vi[1] < 1 || meshf.vi[1] > (int)subd_vertex_count)
          {
            meshf.vi[0] = -1;
            break;
          }
          meshf.vi[1]--;

          if (fvi < face->m_edge_count)
          {
            if (mesh_VertexNeedsDuplicated[meshf.vi[1]])
            {
              dup.m_vertex = vertex;
              dup.m_face = face;
              dup.m_mesh_F_index = mesh.m_F.UnsignedCount();
              dup.m_mesh_V_index = meshf.vi[1];
              dups_array.Append(dup);
            }
          }

          mesh.m_F.Append(meshf);
        }
        ngon_span.j = mesh.m_F.UnsignedCount();

        unsigned int ngon_face_count = ngon_span.j - ngon_span.i;
        if ( -1 == meshf.vi[0] || ngon_face_count != face->EdgeCount() )
        {
          D.SetCount(Dcount0);
          mesh.m_F.SetCount(Fcount0);
          dups_array.SetCount(dup_count0);
          continue;
        }
        ngon_span.j = mesh.m_F.UnsignedCount();
        if (ngon_face_count >= 3)
        {
          ngon_spans.Append(ngon_span);
          if ( ngon_face_count > max_ngon_face_count)
            max_ngon_face_count = ngon_face_count;
        }
      }
    }

    if (mesh.m_F.UnsignedCount() <= 0)
      break;

    rc = true;
    break;
  }

  level.ClearArchiveId();
  if (false == rc )
    return ON_SUBD_RETURN_ERROR(false);

  if (D.UnsignedCount() < 3 || mesh.m_F.UnsignedCount() < 1)
    return ON_SUBD_RETURN_ERROR(false);

  Internal_DuplicateVertices( mesh, D, dups_array);

  // group all mesh faces that came from the same level zero subd face into an ngon.
  if (ngon_spans.UnsignedCount() > 0 && max_ngon_Vcount >= 3)
  {
    ON_SimpleArray< unsigned int> ngon_buffer;
    unsigned int* ngon_fi = ngon_buffer.Reserve(2*max_ngon_Vcount);
    unsigned int* ngon_vi = ngon_fi + max_ngon_Vcount;
    for (unsigned int ngon_dex = 0; ngon_dex < ngon_spans.UnsignedCount(); ngon_dex++ )
    {
      ON_2udex ngon_span = ngon_spans[ngon_dex];
      unsigned int Fcount = ngon_span.j-ngon_span.i;
      if ( Fcount < 3)
        continue;

      ngon_fi[0] = ngon_span.i;
      ngon_fi[0] = (unsigned int)mesh.m_F[ngon_fi[0]].vi[0];

      unsigned int ngon_Vcount = 0;
      for (unsigned int i = ngon_span.i; i < ngon_span.j; i++)
      {
        ngon_fi[ngon_Vcount] = i;
        ngon_vi[ngon_Vcount] = (unsigned int)(mesh.m_F[i].vi[0]);
        ngon_Vcount++;
      }
      mesh.AddNgon(ngon_Vcount, ngon_vi, ngon_Vcount, ngon_fi );
    }
  }

  return true;
}